

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall slang::ast::Scope::addDeferredMembers(Scope *this,SyntaxNode *syntax)

{
  LanguageVersion *pLVar1;
  basic_string_view<char,_std::char_traits<char>_> *sv;
  size_ctrl_type *psVar2;
  group_type_pointer pgVar3;
  char *pcVar4;
  SyntaxKind SVar5;
  Segment *pSVar6;
  pointer ppVar7;
  Symbol *pSVar8;
  size_t __n;
  void *__s1;
  BumpAllocator *this_00;
  Type *this_01;
  size_t sVar9;
  PortSymbol *this_02;
  pointer ppVar10;
  BindDirectiveInfo *pBVar11;
  int *piVar12;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_03;
  GenericClassDefSymbol *this_04;
  StatementBlockSymbol *this_05;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  portDeclarations;
  undefined8 uVar13;
  undefined8 uVar14;
  StackAllocator<const_slang::syntax::BindDirectiveSyntax_*,_32UL,_16UL> SVar15;
  byte bVar16;
  int iVar17;
  SyntaxKind SVar18;
  SymbolIndex SVar19;
  uint uVar20;
  uint uVar21;
  SymbolKind SVar22;
  DeferredMemberData *this_06;
  size_t sVar23;
  SyntaxNode *pSVar24;
  WildcardImportSymbol *item;
  SourceLocation location;
  CoverCrossSymbol *this_07;
  Expression *this_08;
  Type *pTVar25;
  undefined4 extraout_var_00;
  Compilation *extraout_RAX;
  Compilation *pCVar26;
  GenerateBlockSymbol *member;
  NetAliasSymbol *member_00;
  GenerateBlockArraySymbol *member_01;
  SpecifyBlockSymbol *member_02;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar27;
  int *piVar28;
  uint64_t uVar29;
  Diagnostic *pDVar30;
  __extent_storage<18446744073709551615UL> _Var31;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX_01;
  Symbol *pSVar32;
  int *piVar33;
  int *piVar34;
  uint32_t unaff_EBX;
  Compilation *pCVar35;
  long *plVar36;
  long lVar37;
  undefined1 *puVar38;
  long *unaff_RBP;
  int *piVar39;
  undefined1 *puVar40;
  long *plVar41;
  uint32_t *puVar42;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *pSVar43;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *pos0;
  long unaff_R12;
  ulong uVar44;
  long lVar45;
  Symbol *unaff_R13;
  long *unaff_R14;
  BindDirectiveInfo *pBVar46;
  Segment *unaff_R15;
  WildcardImportData **index;
  long lVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uchar uVar51;
  char cVar52;
  uchar uVar53;
  char cVar54;
  uchar uVar55;
  char cVar56;
  byte bVar57;
  char cVar58;
  uchar uVar59;
  char cVar60;
  uchar uVar61;
  char cVar62;
  uchar uVar63;
  char cVar64;
  byte bVar65;
  char cVar66;
  uchar uVar67;
  char cVar68;
  uchar uVar69;
  char cVar70;
  uchar uVar71;
  char cVar72;
  byte bVar73;
  char cVar74;
  uchar uVar75;
  char cVar76;
  uchar uVar77;
  char cVar78;
  uchar uVar79;
  char cVar80;
  byte bVar81;
  char cVar82;
  LookupLocation LVar83;
  string_view sVar84;
  SourceRange sourceRange;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB;
  Compilation *in_stack_00000018;
  Compilation *in_stack_00000020;
  undefined8 in_stack_00000028;
  long in_stack_00000030;
  undefined8 uStack0000000000000038;
  undefined8 uStack0000000000000040;
  byte bStack0000000000000048;
  undefined8 uStack0000000000000050;
  undefined8 uStack0000000000000058;
  undefined8 uStack0000000000000060;
  undefined8 uStack0000000000000068;
  undefined8 uStack0000000000000070;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_stack_00000080;
  StackAllocator<const_slang::syntax::BindDirectiveSyntax_*,_32UL,_16UL> in_stack_00000088;
  Symbol *in_stack_00000090;
  undefined8 uStack0000000000000098;
  undefined8 uStack00000000000000a0;
  undefined1 in_stack_000000a8 [16];
  WildcardImportData *in_stack_000000b8;
  char cStack00000000000000c8;
  char cStack00000000000000c9;
  char cStack00000000000000ca;
  char cStack00000000000000cb;
  char cStack00000000000000cc;
  char cStack00000000000000cd;
  char cStack00000000000000ce;
  char cStack00000000000000cf;
  char in_stack_000000d0;
  char in_stack_000000d1;
  char in_stack_000000d2;
  char in_stack_000000d3;
  char in_stack_000000d4;
  char in_stack_000000d5;
  char in_stack_000000d6;
  char in_stack_000000d7;
  uchar uStack00000000000000d8;
  uchar uStack00000000000000d9;
  uchar uStack00000000000000da;
  byte bStack00000000000000db;
  uchar uStack00000000000000dc;
  uchar uStack00000000000000dd;
  uchar uStack00000000000000de;
  byte bStack00000000000000df;
  uchar in_stack_000000e0;
  uchar in_stack_000000e1;
  uchar in_stack_000000e2;
  byte in_stack_000000e3;
  uchar in_stack_000000e4;
  uchar in_stack_000000e5;
  uchar in_stack_000000e6;
  byte in_stack_000000e7;
  uint64_t in_stack_000000f0;
  not_null<const_slang::ast::Scope_*> in_stack_000000f8;
  Compilation *in_stack_00000100;
  undefined8 uStack0000000000000108;
  undefined8 uStack0000000000000110;
  undefined1 in_stack_00000118 [16];
  AssertionInstanceDetails *in_stack_00000128;
  DeferredMemberData *in_stack_00000130;
  long *in_stack_00000148;
  long *in_stack_00000150;
  long in_stack_00000158;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_stack_00000160;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_stack_00000168;
  long in_stack_00000170;
  char in_stack_00000179;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_stack_00000180;
  uchar in_stack_00000188;
  uchar in_stack_00000189;
  uchar in_stack_0000018a;
  byte in_stack_0000018b;
  uchar in_stack_0000018c;
  uchar in_stack_0000018d;
  uchar in_stack_0000018e;
  byte in_stack_0000018f;
  uchar in_stack_00000190;
  uchar in_stack_00000191;
  uchar in_stack_00000192;
  byte in_stack_00000193;
  uchar in_stack_00000194;
  uchar in_stack_00000195;
  uchar in_stack_00000196;
  byte in_stack_00000197;
  SourceLocation SStackY_70;
  string_view sStackY_68;
  Compilation *pCStackY_58;
  pointer in_stack_ffffffffffffffd8;
  __extent_storage<18446744073709551615UL> _Var85;
  undefined4 extraout_var;
  
  puVar38 = &stack0xffffffffffffffd8;
  pCVar26 = this->compilation;
  pSVar6 = (pCVar26->super_BumpAllocator).head;
  pCVar35 = (Compilation *)((ulong)(pSVar6->current + 7) & 0xfffffffffffffff8);
  pLVar1 = &(pCVar35->options).languageVersion;
  if ((pCVar26->super_BumpAllocator).endPtr < pLVar1) {
    pCVar35 = (Compilation *)BumpAllocator::allocateSlow(&pCVar26->super_BumpAllocator,0x48,8);
  }
  else {
    pSVar6->current = (byte *)pLVar1;
  }
  *(SymbolKind *)&(pCVar35->super_BumpAllocator).head = DeferredMember;
  ((string_view *)&(pCVar35->super_BumpAllocator).endPtr)->_M_len = 0;
  *(char **)&pCVar35->options = "";
  (pCVar35->options).maxUDPCoverageNotes = 0;
  (pCVar35->options).errorLimit = 0;
  (pCVar35->options).maxCheckerInstanceDepth = 0;
  (pCVar35->options).maxGenerateSteps = 0;
  (pCVar35->options).maxConstexprDepth = 0;
  (pCVar35->options).maxConstexprSteps = 0;
  (pCVar35->options).maxConstexprSteps = 0;
  (pCVar35->options).maxConstexprBacktrace = 0;
  (pCVar35->options).maxDefParamSteps = 0;
  (pCVar35->options).maxInstanceArray = 0;
  *(SyntaxNode **)&(pCVar35->options).typoCorrectionLimit = syntax;
  insertMember(this,(Symbol *)pCVar35,this->lastMember,false,true);
  index = (WildcardImportData **)&this->deferredMemberIndex;
  this_06 = Compilation::getOrAddDeferredData(this->compilation,(DeferredMemberIndex *)index);
  pSVar24 = (SyntaxNode *)&stack0xffffffffffffffe0;
  _Var85._M_extent_value = (size_t)pCVar35;
  std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>::
  emplace_back<slang::ast::Symbol*&>
            ((vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>> *)this_06,
             (Symbol **)pSVar24);
  SVar5 = syntax->kind;
  SVar18 = SyntaxList;
  iVar17 = 1;
  if ((int)SVar5 < 0xdd) {
    if ((int)SVar5 < 0x68) {
      if ((int)SVar5 < 0x47) {
        if (SVar5 != AnsiPortList) {
          if (SVar5 == BindDirective) goto switchD_004257cc_caseD_49;
LAB_00425851:
          sVar23 = countGenMembers(syntax);
          iVar17 = (int)sVar23;
          goto switchD_004257cc_caseD_49;
        }
LAB_004258a7:
        pSVar24 = syntax[3].previewNode;
      }
      else {
        _Var31._M_extent_value =
             (long)&switchD_004257cc::switchdataD_00542e9c +
             (long)(int)(&switchD_004257cc::switchdataD_00542e9c)[SVar5 - CheckerInstantiation];
        bVar48 = _Var31._M_extent_value == 0;
        switch(SVar5) {
        case CheckerInstantiation:
          pSVar24 = *(SyntaxNode **)(syntax + 6);
LAB_0042589c:
          iVar17 = (int)((ulong)((long)&pSVar24->kind + 1U) >> 1) + 1;
          goto switchD_004257cc_caseD_49;
        default:
          ppVar7 = (this_06->portDecls).
                   super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pCStackY_58 = pCVar35;
          if (ppVar7 != (pointer)0x0) {
            pSVar32 = (Symbol *)ppVar7->first;
            pSVar8 = ppVar7->second;
            if (pSVar32 != pSVar8) {
              do {
                lVar37 = *(long *)pSVar32;
                __n = *(size_t *)(lVar37 + 0x40);
                __s1 = *(void **)(lVar37 + 0x48);
                sVar84 = parsing::Token::valueText((Token *)(pSVar24 + 1));
                if ((__n == sVar84._M_len) &&
                   ((__n == 0 || (iVar17 = bcmp(__s1,sVar84._M_str,__n), iVar17 == 0)))) {
                  if (*(long *)(lVar37 + 0x40) == 0) {
                    return;
                  }
                  location = parsing::Token::location((Token *)&pSVar24[2].parent);
                  pDVar30 = addDiag((Scope *)this_06,(DiagCode)0x41000a,location);
                  Diagnostic::addNote(pDVar30,(DiagCode)0xa0001,*(SourceLocation *)(lVar37 + 0x18));
                  return;
                }
                pSVar32 = (Symbol *)&pSVar32->name;
              } while (pSVar32 != pSVar8);
            }
          }
          this_00 = (BumpAllocator *)
                    (this_06->members).
                    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          sStackY_68 = parsing::Token::valueText((Token *)(pSVar24 + 1));
          SStackY_70 = parsing::Token::location((Token *)&pSVar24[2].parent);
          item = BumpAllocator::
                 emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                           (this_00,&sStackY_68,&SStackY_70);
          (item->super_Symbol).originatingSyntax = pSVar24;
          syntax_00._M_extent._M_extent_value = _Var31._M_extent_value;
          syntax_00._M_ptr = (pointer)&switchD_004257cc::switchdataD_00542e9c;
          Symbol::setAttributes(&item->super_Symbol,(Scope *)this_06,syntax_00);
          insertMember((Scope *)this_06,&item->super_Symbol,
                       (Symbol *)
                       (this_06->forwardingTypedefs).
                       super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,false,true);
          addWildcardImport((Scope *)this_06,item);
          return;
        case ClassMethodDeclaration:
        case ClockingDeclaration:
          goto switchD_004257cc_caseD_49;
        case ClockingItem:
switchD_004257cc_caseD_50:
          pSVar24 = syntax[5].previewNode;
          break;
        case ClockingPropertyExpr:
          iRam0000000000000001 = iRam0000000000000001 + 1;
          psVar2 = &pCVar35[-0x9264a].globalInstantiations.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .size_ctrl;
          *(char *)&psVar2->ml = (char)psVar2->ml + '\x01';
          if (-1 < (char)psVar2->ml) {
            iRam0000000000000001 =
                 CONCAT31(iRam0000000000000001._1_3_,(char)iRam0000000000000001 + '\x01');
          }
code_r0x00426863:
          if (0x46 < (int)SVar18) {
            (*(code *)((long)&switchD_0042687d::switchdataD_00542ec4 +
                      (long)(int)(&switchD_0042687d::switchdataD_00542ec4)
                                 [SVar18 - CheckerInstantiation]))();
            return;
          }
          if (SVar18 == AnsiPortList) goto LAB_00426d20;
          if (SVar18 != BindDirective) {
            unaff_R15 = (Segment *)&stack0x00000010;
            pCVar26 = (Compilation *)
                      (((Compilation *)_Var85._M_extent_value)->super_BumpAllocator).head;
            bVar48 = isUninstantiated((Scope *)_Var85._M_extent_value);
            GenerateBlockSymbol::fromSyntax
                      (pCVar26,(CaseGenerateSyntax *)syntax,(ASTContext *)&stack0x000000f8,unaff_EBX
                       ,bVar48,(SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                               &stack0xfffffffffffffff8);
            unaff_R13->indexInScope = unaff_R13->indexInScope;
            goto LAB_0042735f;
          }
          Compilation::noteBindDirective
                    ((Compilation *)
                     (((Compilation *)_Var85._M_extent_value)->super_BumpAllocator).head,
                     (BindDirectiveSyntax *)syntax,(Scope *)_Var85._M_extent_value);
LAB_004274c1:
          unaff_R12 = unaff_R12 + 8;
          if ((long *)unaff_R12 != unaff_RBP) {
            unaff_R13 = *(Symbol **)unaff_R12;
            LVar83 = LookupLocation::before(unaff_R13);
            in_stack_000000f8.ptr = (Scope *)_Var85._M_extent_value;
            in_stack_00000100 = (Compilation *)CONCAT44(in_stack_00000100._4_4_,LVar83.index);
            in_stack_00000118 = (undefined1  [16])0x0;
            _uStack0000000000000108 = (undefined1  [16])0x0;
            in_stack_00000128 = (AssertionInstanceDetails *)0x0;
            syntax = *(SyntaxNode **)(unaff_R13 + 1);
            SVar18 = (((CoverCrossSyntax *)syntax)->super_MemberSyntax).super_SyntaxNode.kind;
            _Var85._M_extent_value = (size_t)in_stack_000000f8.ptr;
            if (0xdc < (int)SVar18) {
              if ((int)SVar18 < 0x142) {
                if ((int)SVar18 < 0x11f) {
                  if (SVar18 == GenerateBlock) {
                    member = GenerateBlockSymbol::fromSyntax
                                       (in_stack_000000f8.ptr,(GenerateBlockSyntax *)syntax,
                                        unaff_EBX);
                    insertMember((Scope *)_Var85._M_extent_value,&member->super_Symbol,unaff_R13,
                                 true,true);
                  }
                  else {
                    if (SVar18 == HierarchyInstantiation) {
                      in_stack_00000088.storage = (Storage *)((long)&stack0x00000098 + 8);
                      in_stack_00000090 = (Symbol *)0x0;
                      uStack0000000000000098 = 5;
                      in_stack_ffffffffffffffd8 = (pointer)0x0;
                      InstanceSymbol::fromSyntax
                                ((Compilation *)
                                 (((Compilation *)in_stack_000000f8.ptr)->super_BumpAllocator).head,
                                 (HierarchyInstantiationSyntax *)syntax,
                                 (ASTContext *)&stack0x000000f8,
                                 (SmallVectorBase<const_slang::ast::Symbol_*> *)
                                 &stack0xfffffffffffffff8,
                                 (SmallVectorBase<const_slang::ast::Symbol_*> *)&stack0x00000088,
                                 (BindDirectiveInfo *)0x0,(SyntaxNode *)0x0);
                      SVar15.storage = in_stack_00000088.storage;
                      SVar19 = unaff_R13->indexInScope - 1;
                      unaff_R13->indexInScope = SVar19;
                      if (in_stack_00000090 != (Symbol *)0x0) {
                        lVar45 = (long)in_stack_00000090 << 3;
                        lVar37 = 0;
                        pSVar32 = unaff_R13;
                        do {
                          unaff_R13 = *(Symbol **)
                                       ((long)&((BumpAllocator *)(SVar15.storage)->buffer)->head +
                                       lVar37);
                          insertMember((Scope *)_Var85._M_extent_value,unaff_R13,pSVar32,true,false)
                          ;
                          lVar37 = lVar37 + 8;
                          pSVar32 = unaff_R13;
                        } while (lVar45 != lVar37);
                        SVar19 = unaff_R13->indexInScope;
                      }
                      unaff_R13->indexInScope = SVar19 + 1;
                      goto LAB_00427182;
                    }
                    unaff_R15 = (Segment *)&stack0x00000010;
                    pCVar26 = (Compilation *)
                              (((Compilation *)in_stack_000000f8.ptr)->super_BumpAllocator).head;
                    bVar48 = isUninstantiated(in_stack_000000f8.ptr);
                    GenerateBlockSymbol::fromSyntax
                              (pCVar26,(IfGenerateSyntax *)syntax,(ASTContext *)&stack0x000000f8,
                               unaff_EBX,bVar48,
                               (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                               &stack0xfffffffffffffff8);
                    unaff_R13->indexInScope = unaff_R13->indexInScope;
LAB_0042735f:
                    if (unaff_R15 != (Segment *)&stack0x00000010) {
                      operator_delete(unaff_R15);
                    }
                  }
                }
                else {
                  if (SVar18 != LoopGenerate) {
                    if (SVar18 == ModportDeclaration) {
                      unaff_R15 = (Segment *)&stack0x00000010;
                      ModportSymbol::fromSyntax
                                ((ASTContext *)&stack0x000000f8,(ModportDeclarationSyntax *)syntax,
                                 (SmallVectorBase<const_slang::ast::ModportSymbol_*> *)
                                 &stack0xfffffffffffffff8);
                      unaff_R13->indexInScope = unaff_R13->indexInScope;
                      goto LAB_004274af;
                    }
                    goto LAB_00426c93;
                  }
                  member_01 = GenerateBlockArraySymbol::fromSyntax
                                        ((Compilation *)
                                         (((Compilation *)in_stack_000000f8.ptr)->
                                         super_BumpAllocator).head,(LoopGenerateSyntax *)syntax,
                                         unaff_R13->indexInScope,(ASTContext *)&stack0x000000f8,
                                         unaff_EBX);
                  insertMember((Scope *)_Var85._M_extent_value,&member_01->super_Symbol,unaff_R13,
                               true,true);
                }
                unaff_EBX = unaff_EBX + 1;
              }
              else if ((int)SVar18 < 0x176) {
                if (SVar18 == NetAlias) {
                  member_00 = NetAliasSymbol::fromSyntax
                                        ((ASTContext *)&stack0x000000f8,(NetAliasSyntax *)syntax,
                                         (SmallVectorBase<const_slang::ast::Symbol_*> *)
                                         &stack0xfffffffffffffff8);
                  SVar19 = unaff_R13->indexInScope;
                  unaff_R13->indexInScope = SVar19 - 2;
                  unaff_R13->indexInScope = SVar19 - 1;
                  insertMember((Scope *)_Var85._M_extent_value,&member_00->super_Symbol,unaff_R13,
                               true,true);
                }
                else if (SVar18 == NonAnsiPortList) {
LAB_00426d20:
                  in_stack_00000088.storage = (Storage *)((long)&stack0x00000098 + 8);
                  in_stack_00000090 = (Symbol *)0x0;
                  uStack0000000000000098 = 5;
                  portDeclarations._M_extent._M_extent_value = _Var85._M_extent_value;
                  portDeclarations._M_ptr = in_stack_ffffffffffffffd8;
                  PortSymbol::fromSyntax
                            ((PortSymbol *)syntax,(PortListSyntax *)_Var85._M_extent_value,
                             (Scope *)&stack0x00000088,
                             (SmallVectorBase<const_slang::ast::Symbol_*> *)&stack0xfffffffffffffff8
                             ,in_stack_00000160,portDeclarations);
                  SVar15.storage = in_stack_00000088.storage;
                  unaff_R13->indexInScope = unaff_R13->indexInScope - (int)in_stack_00000090;
                  src = extraout_RDX;
                  if (in_stack_00000090 != (Symbol *)0x0) {
                    lVar37 = (long)in_stack_00000090 << 3;
                    lVar45 = 0;
                    do {
                      pSVar32 = *(Symbol **)
                                 ((long)&((BumpAllocator *)(SVar15.storage)->buffer)->head + lVar45)
                      ;
                      insertMember((Scope *)_Var85._M_extent_value,pSVar32,unaff_R13,true,true);
                      lVar45 = lVar45 + 8;
                      src = extraout_RDX_00;
                      unaff_R13 = pSVar32;
                    } while (lVar37 != lVar45);
                  }
                  sVar9 = ((string_view *)
                          &(((Compilation *)_Var85._M_extent_value)->super_BumpAllocator).endPtr)->
                          _M_len;
                  iVar17 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                                     ((SmallVectorBase<const_slang::ast::Symbol_*> *)
                                      &stack0x00000088,
                                      (EVP_PKEY_CTX *)
                                      (((Compilation *)_Var85._M_extent_value)->super_BumpAllocator)
                                      .head,src);
                  *(ulong *)(sVar9 + 0x98) = CONCAT44(extraout_var_00,iVar17);
                  *(undefined8 *)(sVar9 + 0xa0) = extraout_RDX_01;
                  pCVar26 = (Compilation *)((long)&stack0x00000098 + 8);
                  if ((Compilation *)in_stack_00000088.storage != pCVar26) {
                    operator_delete(in_stack_00000088.storage);
                    pCVar26 = extraout_RAX;
                  }
                  in_stack_00000080 =
                       (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                        *)CONCAT71((int7)((ulong)pCVar26 >> 8),1);
                }
              }
              else {
                if (SVar18 == PrimitiveInstantiation) {
                  in_stack_00000088.storage = (Storage *)((long)&stack0x00000098 + 8);
                  in_stack_00000090 = (Symbol *)0x0;
                  uStack0000000000000098 = 5;
                  PrimitiveInstanceSymbol::fromSyntax
                            ((PrimitiveInstantiationSyntax *)syntax,(ASTContext *)&stack0x000000f8,
                             (SmallVectorBase<const_slang::ast::Symbol_*> *)&stack0xfffffffffffffff8
                             ,(SmallVectorBase<const_slang::ast::Symbol_*> *)&stack0x00000088);
                  SVar15.storage = in_stack_00000088.storage;
                  SVar19 = unaff_R13->indexInScope - 1;
                  unaff_R13->indexInScope = SVar19;
                  if (in_stack_00000090 != (Symbol *)0x0) {
                    lVar45 = (long)in_stack_00000090 << 3;
                    lVar37 = 0;
                    pSVar32 = unaff_R13;
                    do {
                      unaff_R13 = *(Symbol **)
                                   ((long)&((BumpAllocator *)(SVar15.storage)->buffer)->head +
                                   lVar37);
                      insertMember((Scope *)_Var85._M_extent_value,unaff_R13,pSVar32,true,false);
                      lVar37 = lVar37 + 8;
                      pSVar32 = unaff_R13;
                    } while (lVar45 != lVar37);
                    SVar19 = unaff_R13->indexInScope;
                  }
                  unaff_R13->indexInScope = SVar19 + 1;
                  goto LAB_00427182;
                }
                if (SVar18 == ProgramDeclaration) {
LAB_00426c93:
                  _uStack00000000000000d8 =
                       (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                        *)CONCAT71((uint7)(uint3)(SVar18 >> 8),1);
                }
                else {
                  member_02 = SpecifyBlockSymbol::fromSyntax
                                        (in_stack_000000f8.ptr,(SpecifyBlockSyntax *)syntax,
                                         (SmallVector<const_slang::ast::Symbol_*,_5UL> *)
                                         &stack0xfffffffffffffff8);
                  SVar19 = unaff_R13->indexInScope;
                  unaff_R13->indexInScope = SVar19 - 2;
                  unaff_R13->indexInScope = SVar19 - 1;
                  insertMember((Scope *)_Var85._M_extent_value,&member_02->super_Symbol,unaff_R13,
                               true,true);
                }
              }
              goto LAB_004274c1;
            }
            if (0x67 < (int)SVar18) {
              if ((int)SVar18 < 0x7b) {
                if (SVar18 == ContinuousAssign) {
                  in_stack_00000088.storage = (Storage *)((long)&stack0x00000098 + 8);
                  in_stack_00000090 = (Symbol *)0x0;
                  uStack0000000000000098 = 5;
                  ContinuousAssignSymbol::fromSyntax
                            ((Compilation *)
                             (((Compilation *)in_stack_000000f8.ptr)->super_BumpAllocator).head,
                             (ContinuousAssignSyntax *)syntax,(ASTContext *)&stack0x000000f8,
                             (SmallVectorBase<const_slang::ast::Symbol_*> *)&stack0xfffffffffffffff8
                             ,(SmallVectorBase<const_slang::ast::Symbol_*> *)&stack0x00000088);
                  SVar15.storage = in_stack_00000088.storage;
                  SVar19 = unaff_R13->indexInScope - 1;
                  unaff_R13->indexInScope = SVar19;
                  if (in_stack_00000090 != (Symbol *)0x0) {
                    lVar45 = (long)in_stack_00000090 << 3;
                    lVar37 = 0;
                    pSVar32 = unaff_R13;
                    do {
                      unaff_R13 = *(Symbol **)
                                   ((long)&((BumpAllocator *)(SVar15.storage)->buffer)->head +
                                   lVar37);
                      insertMember((Scope *)_Var85._M_extent_value,unaff_R13,pSVar32,true,false);
                      lVar37 = lVar37 + 8;
                      pSVar32 = unaff_R13;
                    } while (lVar45 != lVar37);
                    SVar19 = unaff_R13->indexInScope;
                  }
                  unaff_R13->indexInScope = SVar19 + 1;
LAB_00427182:
                  if ((Compilation *)in_stack_00000088.storage !=
                      (Compilation *)((long)&stack0x00000098 + 8)) {
                    operator_delete(in_stack_00000088.storage);
                  }
                }
                else if (SVar18 == CoverCross) {
                  pCVar26 = (Compilation *)in_stack_000000f8.ptr;
                  this_07 = CoverCrossSymbol::fromSyntax
                                      (in_stack_000000f8.ptr,(CoverCrossSyntax *)syntax,
                                       (SmallVectorBase<const_slang::ast::Symbol_*> *)
                                       &stack0xfffffffffffffff8);
                  SVar19 = unaff_R13->indexInScope;
                  unaff_R13->indexInScope = SVar19 - 2;
                  unaff_R13->indexInScope = SVar19 - 1;
                  _Var85._M_extent_value = (size_t)pCVar26;
                  insertMember((Scope *)pCVar26,&this_07->super_Symbol,unaff_R13,true,true);
                  CoverCrossSymbol::addBody
                            (this_07,*(CoverCrossSyntax **)(unaff_R13 + 1),(Scope *)pCVar26);
                  unaff_RBP = unaff_R14;
                }
                else {
                  unaff_R15 = (Segment *)&stack0x00000010;
                  tryFixupInstances(in_stack_000000f8.ptr,(DataDeclarationSyntax *)syntax,
                                    (ASTContext *)&stack0x000000f8,
                                    (SmallVectorBase<const_slang::ast::Symbol_*> *)
                                    &stack0xfffffffffffffff8);
                  unaff_R13->indexInScope = unaff_R13->indexInScope;
LAB_004274af:
                  if (unaff_R15 != (Segment *)&stack0x00000010) {
                    operator_delete(unaff_R15);
                  }
                }
              }
              else if (SVar18 == DefaultClockingReference) {
                Compilation::noteDefaultClocking
                          ((Compilation *)
                           (((Compilation *)in_stack_000000f8.ptr)->super_BumpAllocator).head,
                           (ASTContext *)&stack0x000000f8,(DefaultClockingReferenceSyntax *)syntax);
              }
              else if (SVar18 == DefaultDisableDeclaration) {
                iVar17 = Expression::bind((int)(((CoverCrossSyntax *)syntax)->items).
                                               super_SyntaxListBase.super_SyntaxNode.previewNode,
                                          (sockaddr *)&stack0x000000f8,0);
                this_08 = (Expression *)CONCAT44(extraout_var,iVar17);
                bVar48 = Expression::bad(this_08);
                if (!bVar48) {
                  this_01 = (this_08->type).ptr;
                  pTVar25 = this_01->canonical;
                  if (pTVar25 == (Type *)0x0) {
                    Type::resolveCanonical(this_01);
                    pTVar25 = this_01->canonical;
                  }
                  if ((pTVar25->super_Symbol).kind != VoidType) {
                    ASTContext::requireBooleanConvertible((ASTContext *)&stack0x000000f8,this_08);
                  }
                  Compilation::noteDefaultDisable
                            ((Compilation *)
                             (((Compilation *)_Var85._M_extent_value)->super_BumpAllocator).head,
                             (Scope *)_Var85._M_extent_value,this_08);
                }
              }
              goto LAB_004274c1;
            }
            goto code_r0x00426863;
          }
          plVar36 = _cStack00000000000000c8;
          pCVar26 = (Compilation *)_Var85._M_extent_value;
          if (((byte)_uStack00000000000000d8 & _cStack00000000000000c8 != unaff_RBP) == 1) {
            do {
              SVar5 = ((*(ModuleDeclarationSyntax **)(*plVar36 + 0x40))->super_MemberSyntax).
                      super_SyntaxNode.kind;
              if ((SVar5 == ProgramDeclaration) || (SVar5 == ModuleDeclaration)) {
                handleNestedDefinition
                          ((Scope *)_Var85._M_extent_value,
                           *(ModuleDeclarationSyntax **)(*plVar36 + 0x40));
              }
              plVar36 = plVar36 + 1;
            } while (plVar36 != unaff_RBP);
          }
          if (((ulong)in_stack_00000080 & 1) == 0) {
            in_stack_00000080 = in_stack_00000168;
            pSVar43 = in_stack_00000160;
            if (in_stack_00000160 != in_stack_00000168) {
              do {
                ppVar10 = pSVar43->data_;
                lVar37 = 0x90;
                if (*(int *)&ppVar10->first == 0x16f) {
                  lVar37 = 0x58;
                }
                uVar44 = *(long *)((long)&ppVar10[3].first + lVar37) + 1;
                _uStack00000000000000d8 = pSVar43;
                if (1 < uVar44) {
                  uVar44 = uVar44 >> 1;
                  lVar45 = 0;
                  do {
                    ppSVar27 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                           *)(*(long *)((long)&ppVar10[2].second + lVar37) + lVar45)
                                         );
                    pSVar24 = *ppSVar27;
                    sVar84 = parsing::Token::valueText((Token *)(pSVar24 + 1));
                    if (sVar84._M_len != 0) {
                      sourceRange = slang::syntax::SyntaxNode::sourceRange(pSVar24);
                      pDVar30 = addDiag((Scope *)pCVar26,(DiagCode)0xd40006,sourceRange);
                      Diagnostic::operator<<(pDVar30,sVar84);
                      break;
                    }
                    lVar45 = lVar45 + 0x30;
                    uVar44 = uVar44 - 1;
                  } while (uVar44 != 0);
                }
                pSVar43 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                           *)&_uStack00000000000000d8->cap;
              } while (pSVar43 != in_stack_00000080);
            }
          }
          else {
            sVar9 = ((string_view *)
                    &(((Compilation *)_Var85._M_extent_value)->super_BumpAllocator).endPtr)->_M_len;
            lVar37 = *(long *)(sVar9 + 0xa0);
            if (lVar37 != 0) {
              lVar45 = *(long *)(sVar9 + 0x98);
              lVar47 = 0;
              do {
                this_02 = *(PortSymbol **)(lVar45 + lVar47);
                SVar22 = (this_02->super_Symbol).kind;
                if (SVar22 == MultiPort) {
                  MultiPortSymbol::getType((MultiPortSymbol *)this_02);
                }
                else if (SVar22 == Port) {
                  PortSymbol::getType(this_02);
                }
                lVar47 = lVar47 + 8;
              } while (lVar37 << 3 != lVar47);
            }
          }
          pCVar35 = pCVar26;
          if (in_stack_00000179 == '\x01') {
            in_stack_00000018 = (Compilation *)&stack0xfffffffffffffff8;
            in_stack_00000028 = 0x3f;
            in_stack_00000030 = 1;
            _uStack0000000000000038 = ZEXT816(0x5122f0);
            _bStack0000000000000048 = (undefined1  [16])0x0;
            in_stack_00000090 = (Symbol *)CONCAT44(in_stack_00000090._4_4_,0xffffffff);
            _uStack0000000000000098 = (undefined1  [16])0x0;
            in_stack_000000a8 = (undefined1  [16])0x0;
            in_stack_000000b8 = (WildcardImportData *)0x0;
            uStack0000000000000108 = &stack0x00000088;
            sVar9 = ((string_view *)&(pCVar26->super_BumpAllocator).endPtr)->_M_len;
            lVar37 = *(long *)(sVar9 + 0x80);
            in_stack_00000020 = in_stack_00000018;
            in_stack_00000088.storage = (Storage *)pCVar26;
            in_stack_000000f8.ptr = (Scope *)in_stack_00000018;
            in_stack_00000100 = pCVar26;
            if (lVar37 != 0) {
              pBVar46 = *(BindDirectiveInfo **)(lVar37 + 0x60);
              pBVar11 = *(BindDirectiveInfo **)(lVar37 + 0x68);
              if (pBVar46 != pBVar11) {
                do {
                  if (pBVar46[1].bindSyntax == (BindDirectiveSyntax *)0x0) {
                    elaborate::anon_class_24_3_bf36fd74::operator()
                              ((anon_class_24_3_bf36fd74 *)&stack0x000000f8,pBVar46);
                  }
                  pBVar46 = (BindDirectiveInfo *)&pBVar46[1].configRuleSyntax;
                } while (pBVar46 != pBVar11);
              }
            }
            lVar37 = *(long *)(sVar9 + 0x90);
            pBVar46 = *(BindDirectiveInfo **)(lVar37 + 0x2b0);
            pBVar11 = *(BindDirectiveInfo **)(lVar37 + 0x2b8);
            if (pBVar46 != pBVar11) {
              do {
                elaborate::anon_class_24_3_bf36fd74::operator()
                          ((anon_class_24_3_bf36fd74 *)&stack0x000000f8,pBVar46);
                pBVar46 = pBVar46 + 1;
              } while (pBVar46 != pBVar11);
            }
            in_stack_00000088.storage = (Storage *)in_stack_00000020;
            if ((BindDirectiveSyntax **)uStack0000000000000040 != (BindDirectiveSyntax **)0x0) {
              slang::detail::hashing::
              StackAllocator<const_slang::syntax::BindDirectiveSyntax_*,_32UL,_16UL>::deallocate
                        (&stack0x00000088,(BindDirectiveSyntax **)uStack0000000000000040,
                         in_stack_00000030 * 0x88 + 0x96U >> 3);
            }
          }
          if ((_cStack00000000000000c8 != unaff_R14) &&
             (piVar28 = *(int **)&(pCVar26->options).maxCheckerInstanceDepth, piVar28 != (int *)0x0)
             ) {
            piVar39 = *(int **)&(pCVar26->options).maxConstexprDepth;
            piVar33 = (int *)0x0;
            do {
              piVar34 = piVar28;
              if (*piVar28 == 4) {
                piVar12 = *(int **)(piVar28 + 10);
                puVar42 = (uint32_t *)(piVar33 + 10);
                if (piVar33 == (int *)0x0) {
                  puVar42 = &(pCVar26->options).maxCheckerInstanceDepth;
                }
                *(int **)puVar42 = piVar12;
                piVar34 = piVar33;
                if (piVar39 == piVar28) {
                  *(int **)&(pCVar26->options).maxConstexprDepth = piVar12;
                  piVar39 = piVar12;
                }
              }
              piVar28 = *(int **)(piVar28 + 10);
              piVar33 = piVar34;
            } while (piVar28 != (int *)0x0);
          }
          uStack0000000000000040 = &stack0xfffffffffffffff8;
          uStack0000000000000038 = &stack0xfffffffffffffff8;
          uStack0000000000000050 = 1;
          _bStack0000000000000048 = 0x3f;
          _uStack0000000000000058 = ZEXT816(0x5122f0);
          _uStack0000000000000068 = (undefined1  [16])0x0;
          plVar36 = in_stack_00000148;
          while( true ) {
            if (plVar36 == in_stack_00000150) {
              this_05 = (StatementBlockSymbol *)
                        ((string_view *)&(pCVar35->super_BumpAllocator).endPtr)->_M_len;
              SVar22 = (this_05->super_Symbol).kind;
              if (SVar22 == StatementBlock) {
                in_stack_000000f8.ptr = (Scope *)0x0;
                in_stack_00000090 = (Symbol *)&stack0x000000f8;
                insertCB.callable = (intptr_t)&stack0x00000088;
                insertCB.callback =
                     function_ref<void(slang::ast::Symbol_const&)>::
                     callback_fn<slang::ast::Scope::elaborate()const::__6>;
                in_stack_00000088.storage = (Storage *)pCVar35;
                StatementBlockSymbol::elaborateVariables(this_05,insertCB);
                SVar22 = *(SymbolKind *)
                          ((string_view *)&(pCVar35->super_BumpAllocator).endPtr)->_M_len;
              }
              if ((SVar22 == InstanceBody) && (TimeTrace::profiler != 0)) {
                TimeTrace::endTrace();
              }
              boost::unordered::detail::foa::
              table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
              ::delete_((allocator_type)uStack0000000000000040,
                        (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                         *)&stack0x00000048);
              if (in_stack_00000160 !=
                  (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                  0x0) {
                operator_delete(in_stack_00000160,in_stack_00000170 - (long)in_stack_00000160);
              }
              if (in_stack_00000148 != (long *)0x0) {
                operator_delete(in_stack_00000148,in_stack_00000158 - (long)in_stack_00000148);
              }
              this_06 = in_stack_00000130;
              if (in_stack_00000130 == (DeferredMemberData *)0x0) {
                return;
              }
              goto code_r0x00427c3d;
            }
            lVar37 = *plVar36;
            if (*(long *)(lVar37 + 8) != 0) break;
LAB_0042789b:
            plVar36 = plVar36 + 1;
          }
          sv = (basic_string_view<char,_std::char_traits<char>_> *)(lVar37 + 8);
          uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              ((long)&stack0x00000038 + 8),sv);
          pSVar43 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *
                    )(uVar29 >> (bStack0000000000000048 & 0x3f));
          lVar45 = (uVar29 & 0xff) * 4;
          uVar51 = (&UNK_0051239c)[lVar45];
          uVar53 = (&UNK_0051239d)[lVar45];
          uVar55 = (&UNK_0051239e)[lVar45];
          bVar57 = (&UNK_0051239f)[lVar45];
          uVar21 = (uint)uVar29;
          plVar41 = (long *)0x0;
          pos0 = pSVar43;
          uVar59 = uVar51;
          uVar61 = uVar53;
          uVar63 = uVar55;
          bVar65 = bVar57;
          uVar67 = uVar51;
          uVar69 = uVar53;
          uVar71 = uVar55;
          bVar73 = bVar57;
          uVar75 = uVar51;
          uVar77 = uVar53;
          uVar79 = uVar55;
          bVar81 = bVar57;
          do {
            uVar13 = uStack0000000000000058;
            pgVar3 = (group_type_pointer)(uStack0000000000000058 + pSVar43 * 0x10);
            in_stack_00000188 = pgVar3->m[0].n;
            in_stack_00000189 = pgVar3->m[1].n;
            in_stack_0000018a = pgVar3->m[2].n;
            in_stack_0000018b = pgVar3->m[3].n;
            in_stack_0000018c = pgVar3->m[4].n;
            in_stack_0000018d = pgVar3->m[5].n;
            in_stack_0000018e = pgVar3->m[6].n;
            in_stack_0000018f = pgVar3->m[7].n;
            in_stack_00000190 = pgVar3->m[8].n;
            in_stack_00000191 = pgVar3->m[9].n;
            in_stack_00000192 = pgVar3->m[10].n;
            in_stack_00000193 = pgVar3->m[0xb].n;
            in_stack_00000194 = pgVar3->m[0xc].n;
            in_stack_00000195 = pgVar3->m[0xd].n;
            in_stack_00000196 = pgVar3->m[0xe].n;
            bVar16 = pgVar3->m[0xf].n;
            auVar49[0] = -(in_stack_00000188 == uVar51);
            auVar49[1] = -(in_stack_00000189 == uVar53);
            auVar49[2] = -(in_stack_0000018a == uVar55);
            auVar49[3] = -(in_stack_0000018b == bVar57);
            auVar49[4] = -(in_stack_0000018c == uVar59);
            auVar49[5] = -(in_stack_0000018d == uVar61);
            auVar49[6] = -(in_stack_0000018e == uVar63);
            auVar49[7] = -(in_stack_0000018f == bVar65);
            auVar49[8] = -(in_stack_00000190 == uVar67);
            auVar49[9] = -(in_stack_00000191 == uVar69);
            auVar49[10] = -(in_stack_00000192 == uVar71);
            auVar49[0xb] = -(in_stack_00000193 == bVar73);
            auVar49[0xc] = -(in_stack_00000194 == uVar75);
            auVar49[0xd] = -(in_stack_00000195 == uVar77);
            auVar49[0xe] = -(in_stack_00000196 == uVar79);
            auVar49[0xf] = -(bVar16 == bVar81);
            uVar20 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe);
            in_stack_00000197 = bVar16;
            if (uVar20 != 0) {
              _uStack00000000000000d8 =
                   (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                   CONCAT17(bVar65,CONCAT16(uVar63,CONCAT15(uVar61,CONCAT14(uVar59,CONCAT13(bVar57,
                                                  CONCAT12(uVar55,CONCAT11(uVar53,uVar51)))))));
              uVar14 = uStack0000000000000060;
              in_stack_00000080 = pSVar43;
              _cStack00000000000000c8 = plVar41;
              in_stack_000000e0 = uVar67;
              in_stack_000000e1 = uVar69;
              in_stack_000000e2 = uVar71;
              in_stack_000000e3 = bVar73;
              in_stack_000000e4 = uVar75;
              in_stack_000000e5 = uVar77;
              in_stack_000000e6 = uVar79;
              in_stack_000000e7 = bVar81;
              in_stack_000000f0 = uVar29;
              in_stack_00000180 = pos0;
              do {
                iVar17 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
                  }
                }
                bVar48 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)((long)&stack0x00000038 + 8),sv,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    ((long)&((value_type_pointer)
                                            (uVar14 + (long)pSVar43 * 0xf * 0x10))->_M_len +
                                    (ulong)(uint)(iVar17 << 4)));
                if (bVar48) goto LAB_0042789b;
                uVar20 = uVar20 - 1 & uVar20;
              } while (uVar20 != 0);
              bVar16 = ((group_type_pointer)(uVar13 + pSVar43 * 0x10))->m[0xf].n;
              pSVar43 = in_stack_00000080;
              plVar41 = _cStack00000000000000c8;
              uVar29 = in_stack_000000f0;
              pos0 = in_stack_00000180;
              uVar51 = uStack00000000000000d8;
              uVar53 = uStack00000000000000d9;
              uVar55 = uStack00000000000000da;
              bVar57 = bStack00000000000000db;
              uVar59 = uStack00000000000000dc;
              uVar61 = uStack00000000000000dd;
              uVar63 = uStack00000000000000de;
              bVar65 = bStack00000000000000df;
              uVar67 = in_stack_000000e0;
              uVar69 = in_stack_000000e1;
              uVar71 = in_stack_000000e2;
              bVar73 = in_stack_000000e3;
              uVar75 = in_stack_000000e4;
              uVar77 = in_stack_000000e5;
              uVar79 = in_stack_000000e6;
              bVar81 = in_stack_000000e7;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar21 & 7] & bVar16) == 0) break;
            puVar40 = (undefined1 *)((long)plVar41 + (long)(pSVar43->firstElement + -0x17));
            plVar41 = (long *)((long)plVar41 + 1);
            pSVar43 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                       *)((ulong)puVar40 & uStack0000000000000050);
          } while (plVar41 <= (ulong)uStack0000000000000050);
          if ((ulong)uStack0000000000000070 < (ulong)uStack0000000000000068) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
            ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>const&>
                      ((locator *)&stack0x00000088,
                       (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                        *)((long)&stack0x00000038 + 8),(arrays_type *)&stack0x00000048,(size_t)pos0,
                       uVar29,sv);
            uStack0000000000000070 = uStack0000000000000070 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
            ::
            unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>const&>
                      ((locator *)&stack0x00000088,
                       (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                        *)((long)&stack0x00000038 + 8),uVar29,sv);
          }
          this_03 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> **)
                     &pCVar35->options;
          uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             (this_03,sv);
          uVar44 = uVar29 >> ((byte)*this_03 & 0x3f);
          lVar45 = (uVar29 & 0xff) * 4;
          cVar52 = (&UNK_0051239c)[lVar45];
          cVar54 = (&UNK_0051239d)[lVar45];
          cVar56 = (&UNK_0051239e)[lVar45];
          cVar58 = (&UNK_0051239f)[lVar45];
          lVar47 = 0;
          _cStack00000000000000c8 =
               (long *)CONCAT17(cVar58,CONCAT16(cVar56,CONCAT15(cVar54,CONCAT14(cVar52,*(undefined4
                                                                                         *)(&
                                                  UNK_0051239c + lVar45)))));
          cVar60 = cVar52;
          cVar62 = cVar54;
          cVar64 = cVar56;
          cVar66 = cVar58;
          cVar68 = cVar52;
          cVar70 = cVar54;
          cVar72 = cVar56;
          cVar74 = cVar58;
          cVar76 = cVar52;
          cVar78 = cVar54;
          cVar80 = cVar56;
          cVar82 = cVar58;
          in_stack_000000d0 = cVar52;
          in_stack_000000d1 = cVar54;
          in_stack_000000d2 = cVar56;
          in_stack_000000d3 = cVar58;
          in_stack_000000d4 = cVar52;
          in_stack_000000d5 = cVar54;
          in_stack_000000d6 = cVar56;
          in_stack_000000d7 = cVar58;
          do {
            pcVar4 = (char *)(*(long *)(this_03 + 0x10) + uVar44 * 0x10);
            auVar50[0] = -(*pcVar4 == cVar52);
            auVar50[1] = -(pcVar4[1] == cVar54);
            auVar50[2] = -(pcVar4[2] == cVar56);
            auVar50[3] = -(pcVar4[3] == cVar58);
            auVar50[4] = -(pcVar4[4] == cVar60);
            auVar50[5] = -(pcVar4[5] == cVar62);
            auVar50[6] = -(pcVar4[6] == cVar64);
            auVar50[7] = -(pcVar4[7] == cVar66);
            auVar50[8] = -(pcVar4[8] == cVar68);
            auVar50[9] = -(pcVar4[9] == cVar70);
            auVar50[10] = -(pcVar4[10] == cVar72);
            auVar50[0xb] = -(pcVar4[0xb] == cVar74);
            auVar50[0xc] = -(pcVar4[0xc] == cVar76);
            auVar50[0xd] = -(pcVar4[0xd] == cVar78);
            auVar50[0xe] = -(pcVar4[0xe] == cVar80);
            auVar50[0xf] = -(pcVar4[0xf] == cVar82);
            uVar21 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe);
            if (uVar21 != 0) {
              in_stack_00000080 =
                   (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                   (*(long *)(this_03 + 0x18) + uVar44 * 0x168);
              do {
                _uStack00000000000000d8 =
                     (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                      *)(ulong)uVar21;
                uVar20 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                pcVar4 = in_stack_00000080->firstElement;
                bVar48 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)this_03,sv,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    (pcVar4 + (ulong)uVar20 * 0x18 + -0x18));
                if (bVar48) {
                  this_04 = (GenericClassDefSymbol *)
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                            (pcVar4 + (ulong)uVar20 * 0x18 + -0x18))[1]._M_len;
                  SVar22 = (this_04->super_Symbol).kind;
                  if (SVar22 == ClassType) {
                    ClassType::checkForwardDecls((ClassType *)this_04);
                  }
                  else if (SVar22 == GenericClassDef) {
                    GenericClassDefSymbol::checkForwardDecls(this_04);
                  }
                  else if (SVar22 == TypeAlias) {
                    TypeAliasType::checkForwardDecls((TypeAliasType *)this_04);
                  }
                  else {
                    pDVar30 = addDiag((Scope *)pCVar35,(DiagCode)0x3d000a,
                                      *(SourceLocation *)(lVar37 + 0x18));
                    Diagnostic::operator<<(pDVar30,*(string_view *)(lVar37 + 8));
                  }
                  goto LAB_0042789b;
                }
                uVar21 = (uint)_uStack00000000000000d8 - 1 & (uint)_uStack00000000000000d8;
                cVar52 = cStack00000000000000c8;
                cVar54 = cStack00000000000000c9;
                cVar56 = cStack00000000000000ca;
                cVar58 = cStack00000000000000cb;
                cVar60 = cStack00000000000000cc;
                cVar62 = cStack00000000000000cd;
                cVar64 = cStack00000000000000ce;
                cVar66 = cStack00000000000000cf;
                cVar68 = in_stack_000000d0;
                cVar70 = in_stack_000000d1;
                cVar72 = in_stack_000000d2;
                cVar74 = in_stack_000000d3;
                cVar76 = in_stack_000000d4;
                cVar78 = in_stack_000000d5;
                cVar80 = in_stack_000000d6;
                cVar82 = in_stack_000000d7;
              } while (uVar21 != 0);
            }
            lVar45 = uVar44 + lVar47;
            lVar47 = lVar47 + 1;
            uVar44 = lVar45 + 1U & *(ulong *)(this_03 + 8);
          } while( true );
        case ClockingSequenceExpr:
        case ColonExpressionClause:
        case CompilationUnit:
        case ConcatenationExpression:
        case ConcurrentAssertionMember:
        case ConditionalExpression:
          cRamffffffffffffff86 = cRamffffffffffffff86 + (char)_Var31._M_extent_value;
          puVar38 = &stack0xffffffffffffffd0;
code_r0x00427c3d:
          *(undefined8 *)(puVar38 + -8) = 0x427c4d;
          operator_delete(this_06,*(long *)(puVar38 + 0x168) - (long)this_06);
          return;
        case ClockingSkew:
          do {
            if (bVar48) goto LAB_004274af;
            pSVar32 = *(Symbol **)((long)index + (long)&syntax->kind);
            insertMember((Scope *)_Var85._M_extent_value,pSVar32,unaff_R13,true,true);
            index = index + 1;
            bVar48 = pCVar35 == (Compilation *)index;
            unaff_R13 = pSVar32;
          } while( true );
        case ConditionalConstraint:
          halt_baddata();
        case ConditionalPathDeclaration:
          pSVar32 = (Symbol *)&switchD_004257cc::switchdataD_00542e9c;
          do {
            insertMember((Scope *)_Var85._M_extent_value,unaff_R13,pSVar32,true,true);
            index = index + 1;
            if (pCVar35 == (Compilation *)index) goto LAB_0042735f;
            pSVar32 = unaff_R13;
            unaff_R13 = *(Symbol **)((long)index + (long)syntax);
          } while( true );
        }
      }
    }
    else {
      if (0x7a < (int)SVar5) goto switchD_004257cc_caseD_49;
      if (SVar5 == ContinuousAssign) {
LAB_00425895:
        pSVar24 = syntax[6].previewNode;
        goto LAB_0042589c;
      }
      if (SVar5 == CoverCross) goto LAB_00425884;
      pSVar24 = *(SyntaxNode **)(syntax + 8);
    }
  }
  else {
    if (0x141 < (int)SVar5) {
      if ((int)SVar5 < 0x176) {
        if (SVar5 != NetAlias) {
          if (SVar5 != NonAnsiPortList) goto switchD_004257cc_caseD_50;
          goto LAB_004258a7;
        }
      }
      else {
        if (SVar5 == PrimitiveInstantiation) goto LAB_00425895;
        if (SVar5 == ProgramDeclaration) goto switchD_004257cc_caseD_49;
      }
LAB_00425884:
      iVar17 = 2;
      goto switchD_004257cc_caseD_49;
    }
    if ((int)SVar5 < 0x11f) {
      if (SVar5 == GenerateBlock) goto switchD_004257cc_caseD_49;
      if (SVar5 != HierarchyInstantiation) goto LAB_00425851;
      pSVar24 = syntax[6].parent;
      goto LAB_0042589c;
    }
    if ((SVar5 == LoopGenerate) || (SVar5 != ModportDeclaration)) goto switchD_004257cc_caseD_49;
    pSVar24 = *(SyntaxNode **)(syntax + 6);
  }
  iVar17 = (int)((ulong)((long)&pSVar24->kind + 1U) >> 1);
switchD_004257cc_caseD_49:
  puVar42 = &(pCVar35->options).maxInstanceArray;
  *puVar42 = *puVar42 + iVar17;
  return;
}

Assistant:

void Scope::addDeferredMembers(const SyntaxNode& syntax) {
    auto sym = compilation.emplace<DeferredMemberSymbol>(syntax);
    addMember(*sym);
    getOrAddDeferredData().addMember(sym);

    // We need to figure out how many new symbols could be inserted when we
    // later elaborate this deferred member, so that we can make room in the
    // index space such that no symbols need to overlap.
    sym->indexInScope += (uint32_t)countMembers(syntax);
}